

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void generate_gauss(kernel_t *ker,float sig)

{
  float fVar1;
  double dVar2;
  double dVar3;
  undefined1 in_register_00001204 [12];
  undefined1 auVar4 [16];
  int local_1c;
  int local_18;
  int h;
  int i;
  float sig_local;
  kernel_t *ker_local;
  
  auVar4._4_12_ = in_register_00001204;
  auVar4._0_4_ = sig;
  fVar1 = (float)auVar4._0_8_;
  local_1c = (int)(fVar1 * 6.0 + 1.0);
  if (local_1c % 2 == 0) {
    local_1c = local_1c + 1;
  }
  ker->f = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    for (local_18 = -(int)((double)local_1c / 2.0); local_18 <= (int)((double)local_1c / 2.0);
        local_18 = local_18 + 1) {
      dVar2 = pow((double)local_18,2.0);
      dVar3 = pow((double)fVar1,2.0);
      dVar2 = exp(-dVar2 / (dVar3 * 2.0));
      dVar3 = sqrt(6.283185307179586);
      ker->k[local_18 + (int)((double)local_1c / 2.0)] = (float)(dVar2 / (dVar3 * (double)fVar1));
      ker->f = ker->k[local_18 + (int)((double)local_1c / 2.0)] + ker->f;
    }
  }
  else {
    ker->k[0] = 1.0;
    ker->f = 1.0;
  }
  ker->m = local_1c;
  return;
}

Assistant:

void generate_gauss(ker,sig)
kernel_t *ker ;
float sig ;

{ int i, h ;

  h = (int)(sig*6.0 + 1.0) ;
  if (h%2 == 0) {
    h++ ;
  }
  (*ker).f = 0.0 ;
  if (sig != 0.0) {
    for (i = -(int)(h/2.0) ; i <= (int)(h/2.0) ; i++) {
      (*ker).k[i+(int)(h/2.0)] = exp(-pow((float)i,2.0)/(2.0*pow(sig,2.0)))/
      (sqrt(2.0*M_PI)*sig) ;
      (*ker).f += (*ker).k[i+(int)(h/2.0)] ;
    }
  }
  else {
    (*ker).k[0] = 1.0 ;
    (*ker).f = 1.0 ;
  }
  (*ker).m = h ;
}